

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshCacheItem * __thiscall ON_MeshCache::Internal_FindHelper(ON_MeshCache *this,ON_UUID mesh_id)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  element_type *this_00;
  uchar auVar4 [8];
  bool local_5d;
  uint mesh_face_count;
  ON_Mesh *mesh;
  ON_MeshCacheItem *item;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  bool bCountFaces;
  ON_MeshCacheItem *item_fine_mesh;
  ON_MeshCacheItem *item_coarse_mesh;
  uint fine_mesh_face_count;
  uint coarse_mesh_face_count;
  ON_MeshCache *this_local;
  ON_UUID mesh_id_local;
  
  mesh_id_local._0_8_ = mesh_id.Data4;
  this_local = mesh_id._0_8_;
  item_coarse_mesh._4_4_ = 0xffffffff;
  item_coarse_mesh._0_4_ = 0;
  item_fine_mesh = (ON_MeshCacheItem *)0x0;
  uStack_40 = '\0';
  uStack_3f = '\0';
  uStack_3e = '\0';
  uStack_3d = '\0';
  uStack_3c = '\0';
  uStack_3b = '\0';
  uStack_3a = '\0';
  bCountFaces = false;
  bVar1 = ::operator==(&FineMeshId,(ON_UUID_struct *)&this_local);
  local_5d = true;
  if (!bVar1) {
    local_5d = ::operator==(&CoarseMeshId,(ON_UUID_struct *)&this_local);
  }
  mesh = (ON_Mesh *)this->m_impl;
  while( true ) {
    if (mesh == (ON_Mesh *)0x0) {
      bVar1 = ::operator==(&CoarseMeshId,(ON_UUID_struct *)&this_local);
      if (bVar1) {
        mesh_id_local.Data4 = (uchar  [8])item_fine_mesh;
      }
      else {
        bVar1 = ::operator==(&FineMeshId,(ON_UUID_struct *)&this_local);
        if (bVar1) {
          mesh_id_local.Data4[0] = uStack_40;
          mesh_id_local.Data4[1] = uStack_3f;
          mesh_id_local.Data4[2] = uStack_3e;
          mesh_id_local.Data4[3] = uStack_3d;
          mesh_id_local.Data4[4] = uStack_3c;
          mesh_id_local.Data4[5] = uStack_3b;
          mesh_id_local.Data4[6] = uStack_3a;
          mesh_id_local.Data4[7] = bCountFaces;
        }
        else {
          mesh_id_local.Data4[0] = '\0';
          mesh_id_local.Data4[1] = '\0';
          mesh_id_local.Data4[2] = '\0';
          mesh_id_local.Data4[3] = '\0';
          mesh_id_local.Data4[4] = '\0';
          mesh_id_local.Data4[5] = '\0';
          mesh_id_local.Data4[6] = '\0';
          mesh_id_local.Data4[7] = '\0';
        }
      }
      auVar4[0] = mesh_id_local.Data4[0];
      auVar4[1] = mesh_id_local.Data4[1];
      auVar4[2] = mesh_id_local.Data4[2];
      auVar4[3] = mesh_id_local.Data4[3];
      auVar4[4] = mesh_id_local.Data4[4];
      auVar4[5] = mesh_id_local.Data4[5];
      auVar4[6] = mesh_id_local.Data4[6];
      auVar4[7] = mesh_id_local.Data4[7];
      return (ON_MeshCacheItem *)auVar4;
    }
    bVar1 = ::operator==((ON_UUID_struct *)&this_local,(ON_UUID_struct *)mesh);
    if (bVar1) break;
    if ((((local_5d != false) &&
         (this_00 = std::__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::get
                              ((__shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)&mesh->m_dV),
         this_00 != (element_type *)0x0)) &&
        (uVar2 = ON_Mesh::FaceUnsignedCount(this_00), uVar2 != 0)) &&
       (uVar3 = ON_Mesh::VertexUnsignedCount(this_00), 2 < uVar3)) {
      if ((uint)item_coarse_mesh < uVar2) {
        _uStack_40 = (uchar  [8])mesh;
        item_coarse_mesh._0_4_ = uVar2;
      }
      if (uVar2 < item_coarse_mesh._4_4_) {
        item_fine_mesh = (ON_MeshCacheItem *)mesh;
        item_coarse_mesh._4_4_ = uVar2;
      }
    }
    mesh = *(ON_Mesh **)&(mesh->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count;
  }
  return (ON_MeshCacheItem *)mesh;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_FindHelper(
  ON_UUID mesh_id
  ) const
{
  unsigned int coarse_mesh_face_count = 0xFFFFFFFFU;
  unsigned int fine_mesh_face_count = 0;
  ON_MeshCacheItem* item_coarse_mesh = nullptr;
  ON_MeshCacheItem* item_fine_mesh = nullptr;

  const bool bCountFaces = (ON_MeshCache::FineMeshId == mesh_id || ON_MeshCache::CoarseMeshId == mesh_id);

  for (ON_MeshCacheItem* item = m_impl; nullptr != item; item = item->m_next)
  {
    if (mesh_id == item->m_mesh_id)
      return item;
    if (false == bCountFaces)
      continue;
    const ON_Mesh* mesh = item->m_mesh_sp.get();
    if (nullptr == mesh)
      continue;
    unsigned int mesh_face_count = mesh->FaceUnsignedCount();
    if (mesh_face_count <= 0 || mesh->VertexUnsignedCount() < 3)
      continue;
    if (mesh_face_count > fine_mesh_face_count)
    {
      item_fine_mesh = item;
      fine_mesh_face_count = mesh_face_count;
    }
    if (mesh_face_count < coarse_mesh_face_count)
    {
      item_coarse_mesh = item;
      coarse_mesh_face_count = mesh_face_count;
    }
  }
  
  if (ON_MeshCache::CoarseMeshId == mesh_id)
    return item_coarse_mesh;
  
  if (ON_MeshCache::FineMeshId == mesh_id)
    return item_fine_mesh;

  return nullptr;
}